

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.c
# Opt level: O1

int spi_read(uint addr,uint len,uint8_t *data)

{
  int iVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined8 extraout_RDX;
  ulong uVar4;
  uint8_t msg_buf [3];
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 *puStack_a0;
  undefined8 uStack_98;
  undefined4 uStack_90;
  uint32_t uStack_8c;
  uint16_t uStack_88;
  uint8_t uStack_86;
  undefined4 uStack_85;
  undefined1 uStack_81;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined4 uStack_70;
  uint32_t uStack_6c;
  uint16_t uStack_68;
  uint8_t uStack_66;
  undefined4 uStack_65;
  undefined1 uStack_61;
  code *pcStack_60;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 *local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  uint32_t local_34;
  uint16_t local_30;
  uint8_t local_2e;
  undefined1 local_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined2 uStack_2a;
  undefined3 uStack_28;
  undefined5 uStack_25;
  uint8_t *local_20;
  uint local_18;
  uint32_t local_14;
  uint16_t local_10;
  uint8_t local_e;
  undefined4 local_d;
  undefined1 local_9;
  
  local_34 = speed;
  local_30 = delay;
  local_2e = bits;
  local_2d = 0;
  uStack_2c = 0;
  uStack_2b = 0;
  uStack_2a = 0;
  uStack_28 = 0;
  uStack_25 = 0;
  local_14 = speed;
  local_10 = delay;
  local_e = bits;
  local_d = 0;
  local_9 = 0;
  local_48 = &local_4b;
  local_4b = 1;
  local_4a = (undefined1)(addr >> 8);
  local_49 = (undefined1)addr;
  local_38 = 3;
  uVar2 = 4;
  if (((mode >> 9 & 1) != 0) || (uVar2 = 2, (mode >> 8 & 1) != 0)) {
    uStack_2c = uVar2;
  }
  uVar2 = 4;
  if (((mode >> 0xb & 1) != 0) || (uVar2 = 2, (mode >> 10 & 1) != 0)) {
    uStack_2b = uVar2;
  }
  if ((((mode & 0x20) == 0) && ((mode & 0x300) == 0)) && ((mode & 0xc00) != 0)) {
    local_48 = (undefined1 *)0x0;
  }
  uStack_40 = 0;
  uVar4 = (ulong)(uint)i2s_fd;
  uStack_70 = 0x40406b00;
  pcStack_60 = (code *)0x101e33;
  local_20 = data;
  local_18 = len;
  iVar1 = ioctl(i2s_fd,0x40406b00,&local_48);
  if (0 < iVar1) {
    return 0;
  }
  pcStack_60 = spi_write;
  spi_read_cold_1();
  uStack_98 = 0;
  uStack_8c = speed;
  uStack_88 = delay;
  uStack_86 = bits;
  uStack_85 = 0;
  uStack_81 = 0;
  uStack_6c = speed;
  uStack_68 = delay;
  uStack_66 = bits;
  uStack_65 = 0;
  uStack_61 = 0;
  puStack_a0 = &uStack_a3;
  uStack_a3 = 0;
  uStack_a2 = (undefined1)((uVar4 & 0xffffffff) >> 8);
  uStack_a1 = (undefined1)(uVar4 & 0xffffffff);
  uStack_90 = 3;
  bVar3 = 4;
  if (((mode >> 9 & 1) != 0) || (bVar3 = 2, (mode >> 8 & 1) != 0)) {
    uStack_65 = (uint)bVar3 << 8;
  }
  uVar2 = 4;
  if (((mode >> 0xb & 1) != 0) || (uVar2 = 2, (mode >> 10 & 1) != 0)) {
    uStack_65 = (uint)CONCAT12(uVar2,(undefined2)uStack_65);
  }
  uStack_80 = extraout_RDX;
  if ((((mode & 0x20) == 0) && ((mode & 0x300) == 0)) && ((mode & 0xc00) != 0)) {
    uStack_80 = 0;
  }
  uStack_78 = 0;
  iVar1 = ioctl(i2s_fd,0x40406b00,&puStack_a0);
  if (iVar1 < 1) {
    spi_write_cold_1();
    halt_baddata();
  }
  return 0;
}

Assistant:

static int spi_read(unsigned int addr, unsigned int len, uint8_t *data)
{
	int ret;
	//int out_fd;
	uint8_t msg_buf[3];
	struct spi_ioc_transfer xfer[2] = {
		{
		.tx_buf = (unsigned long)0,
		.rx_buf = (unsigned long)0,
		.len = 3,
		.delay_usecs = delay,
		.speed_hz = speed,
		.bits_per_word = bits,
		},
		{
		.tx_buf = (unsigned long)0,
		.rx_buf = (unsigned long)data,
		.len = len,
		.delay_usecs = delay,
		.speed_hz = speed,
		.bits_per_word = bits,
		}
	};
	msg_buf[0] = 0x01;
	msg_buf[1] = addr >> 8;
	msg_buf[2] = addr & 0xff;
	xfer[0].tx_buf = (unsigned long)msg_buf;
	xfer[0].len = 3;

	if (mode & SPI_TX_QUAD)
		xfer[0].tx_nbits = 4;
	else if (mode & SPI_TX_DUAL)
		xfer[0].tx_nbits = 2;
	if (mode & SPI_RX_QUAD)
		xfer[0].rx_nbits = 4;
	else if (mode & SPI_RX_DUAL)
		xfer[0].rx_nbits = 2;
	if (!(mode & SPI_LOOP)) {
		if (mode & (SPI_TX_QUAD | SPI_TX_DUAL))
			xfer[0].rx_buf = 0;
		else if (mode & (SPI_RX_QUAD | SPI_RX_DUAL))
			xfer[0].tx_buf = 0;
	}

	ret = ioctl(i2s_fd, SPI_IOC_MESSAGE(2), xfer);
	if (ret < 1) {
		pabort("read: can't send spi message");
		return 1;
	}
	return 0;
}